

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

void DoDamage(AActor *dmgtarget,AActor *inflictor,AActor *source,int amount,FName *DamageType,
             int flags,PClassActor *filter,FName *species)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  byte bVar4;
  bool bVar5;
  undefined1 local_5c [36];
  DAngle local_38;
  PClassActor *pPVar3;
  
  pPVar3 = (PClassActor *)(dmgtarget->super_DThinker).super_DObject.Class;
  local_5c._4_8_ = DamageType;
  local_5c._12_8_ = inflictor;
  local_5c._20_8_ = source;
  if (pPVar3 == (PClassActor *)0x0) {
    iVar1 = (**(dmgtarget->super_DThinker).super_DObject._vptr_DObject)(dmgtarget);
    pPVar3 = (PClassActor *)CONCAT44(extraout_var,iVar1);
    (dmgtarget->super_DThinker).super_DObject.Class = (PClass *)pPVar3;
  }
  iVar1 = species->Index;
  AActor::GetSpecies((AActor *)local_5c);
  if (iVar1 == 0) {
    bVar5 = true;
  }
  else if ((char)flags < '\0') {
    bVar5 = local_5c._0_4_ != iVar1;
  }
  else {
    bVar5 = local_5c._0_4_ == iVar1;
  }
  bVar4 = filter == (PClassActor *)0x0 | pPVar3 == filter ^ (byte)((flags & 0x40U) >> 6);
  if (((uint)flags >> 8 & 1) == 0) {
    if ((bVar4 & bVar5) != 1) {
      return;
    }
  }
  else if (bVar4 == 0 && bVar5 == false) {
    return;
  }
  iVar2 = (flags & 1U) * 0x40;
  iVar1 = iVar2 + 0x10;
  if ((flags & 0xcU) == 0) {
    iVar1 = iVar2;
  }
  if ((flags & 4U) != 0) {
    amount = amount + dmgtarget->health;
  }
  if (amount < 1) {
    if (amount < 0) {
      P_GiveBody(dmgtarget,-amount,0);
    }
  }
  else {
    if (((uint)flags >> 9 & 1) == 0) {
      local_5c._32_4_ = *(int *)local_5c._4_8_;
    }
    else {
      local_5c._32_4_ = (((FNameNoInit *)(local_5c._12_8_ + 0x404))->super_FName).Index;
      *(int *)local_5c._4_8_ = local_5c._32_4_;
    }
    local_38.Degrees = 0.0;
    P_DamageMobj(dmgtarget,(AActor *)local_5c._12_8_,(AActor *)local_5c._20_8_,amount,
                 (FName *)(local_5c + 0x20),
                 flags * 8 & 0x100U | (uint)((flags & 6U) != 2) | iVar1 + (flags * 8 & 0x80U),
                 &local_38);
  }
  return;
}

Assistant:

static void DoDamage(AActor *dmgtarget, AActor *inflictor, AActor *source, int amount, FName DamageType, int flags, PClassActor *filter, FName species)
{
	bool filterpass = DoCheckClass(dmgtarget, filter, !!(flags & DMSS_EXFILTER)),
		speciespass = DoCheckSpecies(dmgtarget, species, !!(flags & DMSS_EXSPECIES));
	if ((flags & DMSS_EITHER) ? (filterpass || speciespass) : (filterpass && speciespass))
	{
		int dmgFlags = 0;
		if (flags & DMSS_FOILINVUL)
			dmgFlags |= DMG_FOILINVUL;
		if (flags & DMSS_FOILBUDDHA)
			dmgFlags |= DMG_FOILBUDDHA;
		if (flags & (DMSS_KILL | DMSS_NOFACTOR)) //Kill implies NoFactor
			dmgFlags |= DMG_NO_FACTOR;
		if (!(flags & DMSS_AFFECTARMOR) || (flags & DMSS_KILL)) //Kill overrides AffectArmor
			dmgFlags |= DMG_NO_ARMOR;
		if (flags & DMSS_KILL) //Kill adds the value of the damage done to it. Allows for more controlled extreme death types.
			amount += dmgtarget->health;
		if (flags & DMSS_NOPROTECT) //Ignore PowerProtection.
			dmgFlags |= DMG_NO_PROTECT;
	
		if (amount > 0)
		{ //Should wind up passing them through just fine.
			if (flags & DMSS_INFLICTORDMGTYPE)
				DamageType = inflictor->DamageType;

			P_DamageMobj(dmgtarget, inflictor, source, amount, DamageType, dmgFlags);
		}
		else if (amount < 0)
		{
			amount = -amount;
			P_GiveBody(dmgtarget, amount);
		}
	}
}